

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int exprVectorRegister(Parse *pParse,Expr *pVector,int iField,int regSelect,Expr **ppExpr,
                      int *pRegFree)

{
  Expr *pEVar1;
  int iVar2;
  
  if (pVector->op == '\x7f') {
    *ppExpr = ((pVector->x).pSelect)->pEList->a[iField].pExpr;
    iVar2 = iField + regSelect;
  }
  else {
    if (pVector->op != 0xa4) {
      pEVar1 = ((pVector->x).pList)->a[iField].pExpr;
      *ppExpr = pEVar1;
      iVar2 = sqlite3ExprCodeTemp(pParse,pEVar1,pRegFree);
      return iVar2;
    }
    pEVar1 = sqlite3VectorFieldSubexpr(pVector,iField);
    *ppExpr = pEVar1;
    iVar2 = iField + pVector->iTable;
  }
  return iVar2;
}

Assistant:

static int exprVectorRegister(
  Parse *pParse,                  /* Parse context */
  Expr *pVector,                  /* Vector to extract element from */
  int iField,                     /* Field to extract from pVector */
  int regSelect,                  /* First in array of registers */
  Expr **ppExpr,                  /* OUT: Expression element */
  int *pRegFree                   /* OUT: Temp register to free */
){
  u8 op = pVector->op;
  assert( op==TK_VECTOR || op==TK_REGISTER || op==TK_SELECT );
  if( op==TK_REGISTER ){
    *ppExpr = sqlite3VectorFieldSubexpr(pVector, iField);
    return pVector->iTable+iField;
  }
  if( op==TK_SELECT ){
    *ppExpr = pVector->x.pSelect->pEList->a[iField].pExpr;
     return regSelect+iField;
  }
  *ppExpr = pVector->x.pList->a[iField].pExpr;
  return sqlite3ExprCodeTemp(pParse, *ppExpr, pRegFree);
}